

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::sendInWorker(TCPSocket *this)

{
  Poller *this_00;
  bool bVar1;
  int *piVar2;
  enable_shared_from_this<hwnet::TCPSocket> local_138;
  enable_shared_from_this<hwnet::TCPSocket> local_128;
  enable_shared_from_this<hwnet::TCPSocket> local_118;
  enable_shared_from_this<hwnet::TCPSocket> local_108;
  shared_ptr<hwnet::Channel> local_f8;
  sendContext *local_e8;
  sendContext *front;
  size_t nn;
  ssize_t local_d0;
  ssize_t local_c8;
  long __result;
  sendContext *psStack_b8;
  int n;
  sendContext *cur;
  int local_a8;
  int totalBytes;
  int c;
  int localVer;
  linklist *localSendlist;
  byte local_82;
  byte local_81;
  bool enableWrite;
  size_t sStack_80;
  bool closedOnFlush_;
  size_t bytes4Send_;
  HighWaterCallback highWaterCallback;
  ErrorCallback errorCallback;
  FlushCallback flushCallback;
  anon_enum_32 cb;
  TCPSocket *this_local;
  
  flushCallback._M_invoker._4_4_ = 0;
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)&errorCallback._M_invoker
             ,(nullptr_t)0x0);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
             &highWaterCallback._M_invoker,(nullptr_t)0x0);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
             &bytes4Send_,(nullptr_t)0x0);
  sStack_80 = 0;
  local_81 = 0;
  local_82 = 0;
  std::mutex::lock(&this->mtx);
  bVar1 = canWrite(this);
  if (bVar1) {
    if (((this->writeable & 1U) == 0) && (bVar1 = highWater(this), bVar1)) {
      flushCallback._M_invoker._4_4_ = 1;
      sStack_80 = this->bytes4Send;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
                 &bytes4Send_,&this->highWaterCallback_);
    }
    else {
      _c = this->ptrSendlist;
      totalBytes = this->writeableVer;
      this->slistIdx = (uint)(this->slistIdx == 0);
      this->ptrSendlist = this->sendLists + this->slistIdx;
      std::mutex::unlock(&this->mtx);
      local_a8 = 0;
      cur._4_4_ = 0;
      for (psStack_b8 = _c->head; psStack_b8 != (sendContext *)0x0 && local_a8 < 0x80;
          psStack_b8 = psStack_b8->next) {
        this->send_iovec[local_a8].iov_len = psStack_b8->len;
        this->send_iovec[local_a8].iov_base = psStack_b8->ptr;
        cur._4_4_ = cur._4_4_ + (int)psStack_b8->len;
        local_a8 = local_a8 + 1;
      }
      do {
        local_c8 = writev(this->fd,(iovec *)this->send_iovec,local_a8);
        bVar1 = false;
        if (local_c8 == -1) {
          piVar2 = __errno_location();
          bVar1 = *piVar2 == 4;
        }
      } while (bVar1);
      local_d0 = local_c8;
      __result._4_4_ = (int)local_c8;
      if ((cur._4_4_ <= __result._4_4_) && (psStack_b8 == (sendContext *)0x0)) {
        linklist::clear(_c);
      }
      std::mutex::lock(&this->mtx);
      local_81 = this->closedOnFlush & 1;
      if (__result._4_4_ < 0) {
        if ((__result._4_4_ < 0) && (piVar2 = __errno_location(), *piVar2 == 0xb)) {
          linklist::add_front(this->ptrSendlist,_c);
          if (this->writeableVer == totalBytes) {
            this->writeable = false;
            local_82 = 1;
          }
        }
        else {
          bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->closed);
          if (!bVar1) {
            std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                      ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                       &highWaterCallback._M_invoker,&this->errorCallback_);
            this->socketError = true;
            piVar2 = __errno_location();
            this->err = *piVar2;
            flushCallback._M_invoker._4_4_ = 3;
          }
        }
      }
      else {
        if (this->sendTimeout != 0) {
          nn = std::chrono::_V2::steady_clock::now();
          (this->lastSendTime).__d.__r = nn;
        }
        if ((0 < __result._4_4_) &&
           ((__result._4_4_ < cur._4_4_ || (psStack_b8 != (sendContext *)0x0)))) {
          front = (sendContext *)(long)__result._4_4_;
          while (local_e8 = linklist::front(_c), (sendContext *)local_e8->len <= front) {
            front = (sendContext *)((long)front - local_e8->len);
            linklist::pop_front(_c);
          }
          local_e8->ptr = local_e8->ptr + (long)&front->buff;
          local_e8->len = local_e8->len - (long)front;
          linklist::add_front(this->ptrSendlist,_c);
        }
        this->bytes4Send = this->bytes4Send - (long)__result._4_4_;
        bVar1 = linklist::empty(this->ptrSendlist);
        if (bVar1) {
          if ((this->shutdown & 1U) != 0) {
            shutdown(this->fd,1);
          }
          bVar1 = std::function::operator_cast_to_bool((function *)&this->flushCallback_);
          if (bVar1) {
            std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                      ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)
                       &errorCallback._M_invoker,&this->flushCallback_);
            flushCallback._M_invoker._4_4_ = 2;
          }
        }
      }
    }
    std::mutex::unlock(&this->mtx);
    if ((local_82 & 1) != 0) {
      this_00 = this->poller_;
      std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_108);
      std::shared_ptr<hwnet::Channel>::shared_ptr<hwnet::TCPSocket,void>
                (&local_f8,(shared_ptr<hwnet::TCPSocket> *)&local_108);
      Poller::Enable(this_00,&local_f8,4);
      std::shared_ptr<hwnet::Channel>::~shared_ptr(&local_f8);
      std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_108);
    }
    if (flushCallback._M_invoker._4_4_ == 1) {
      bVar1 = std::function::operator_cast_to_bool((function *)&bytes4Send_);
      if (bVar1) {
        std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_118);
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::operator()
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
                   &bytes4Send_,(shared_ptr<hwnet::TCPSocket> *)&local_118,sStack_80);
        std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_118);
      }
    }
    else if (flushCallback._M_invoker._4_4_ == 2) {
      bVar1 = std::function::operator_cast_to_bool((function *)&errorCallback._M_invoker);
      if (bVar1) {
        std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_128);
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)
                   &errorCallback._M_invoker,(shared_ptr<hwnet::TCPSocket> *)&local_128);
        std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_128);
      }
      if ((local_81 & 1) != 0) {
        Close(this);
      }
    }
    else {
      if (flushCallback._M_invoker._4_4_ != 3) {
        localSendlist._0_4_ = 1;
        goto LAB_00151a64;
      }
      bVar1 = std::function::operator_cast_to_bool((function *)&highWaterCallback._M_invoker);
      if (bVar1) {
        std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_138);
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator()
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                   &highWaterCallback._M_invoker,(shared_ptr<hwnet::TCPSocket> *)&local_138,
                   this->err);
        std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_138);
      }
      else {
        Close(this);
      }
    }
    localSendlist._0_4_ = 0;
  }
  else {
    std::mutex::unlock(&this->mtx);
    localSendlist._0_4_ = 1;
  }
LAB_00151a64:
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
             &bytes4Send_);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
             &highWaterCallback._M_invoker);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)&errorCallback._M_invoker
            );
  return;
}

Assistant:

void TCPSocket::sendInWorker() {
	
	auto cb = nothing;

	FlushCallback flushCallback = nullptr;
	ErrorCallback errorCallback = nullptr;
	HighWaterCallback highWaterCallback = nullptr;
	size_t bytes4Send_ = 0;
	auto closedOnFlush_ = false;
	auto enableWrite = false;//是否需要调用Enable(Write)


	this->mtx.lock();

	
	if(!this->canWrite()){
		this->mtx.unlock();
		return; 
	} else {
		if(!this->writeable && this->highWater()) {
			cb = callHighwaterCallback;
			bytes4Send_ = this->bytes4Send;
			highWaterCallback = this->highWaterCallback_;
		} else {
			auto localSendlist = this->ptrSendlist;
			auto localVer = this->writeableVer;
			this->slistIdx = this->slistIdx == 0 ? 1 : 0;
			this->ptrSendlist = &this->sendLists[this->slistIdx]; 

			this->mtx.unlock();

			auto c   = 0;
			auto totalBytes = 0;
			auto cur =  localSendlist->head;
			for( ; cur != nullptr && c < max_send_iovec_size; cur = cur->next,++c) {
				send_iovec[c].iov_len = cur->len;
				send_iovec[c].iov_base = cur->ptr;
				totalBytes += cur->len;			
			}

			int n = TEMP_FAILURE_RETRY(::writev(this->fd,&this->send_iovec[0],c));

			if(n >= totalBytes && cur == nullptr){
				localSendlist->clear();
			}

			this->mtx.lock();

			closedOnFlush_ = this->closedOnFlush;

			if(n >= 0) {

				if(this->sendTimeout > 0) {
					this->lastSendTime = std::chrono::steady_clock::now();
				}

				if(n > 0 && (n < totalBytes || cur != nullptr)) {
					//部分发送
					size_t nn = (size_t)n;
					for( ; ; ) {
						auto front = localSendlist->front();
						if(nn >= front->len) {
							nn -= front->len;
							localSendlist->pop_front();
						} else {
							front->ptr += nn;
							front->len -= nn;
							break;
						}
					}
					this->ptrSendlist->add_front(localSendlist);
				}

				this->bytes4Send -= n;
				if(this->ptrSendlist->empty()){
					if(this->shutdown){
						::shutdown(this->fd,SHUT_WR);
					}
					if(this->flushCallback_) {
						flushCallback = this->flushCallback_;
						cb = callFlushCallback;
					}
				}

			} else {
				if(n < 0 && errno == EAGAIN) {
					this->ptrSendlist->add_front(localSendlist);
					if(this->writeableVer == localVer) {
						this->writeable = false;
						enableWrite = true;				
					}
				} else {
					if(!this->closed){
						errorCallback = this->errorCallback_;
						this->socketError = true;
						this->err = errno;
						cb = callErrorCallback;
					}
				}
			}
		}
	}


	this->mtx.unlock();

	if(enableWrite) {
		this->poller_->Enable(shared_from_this(),Poller::Write);
	}

	switch(cb){
		case callHighwaterCallback:{
			if(highWaterCallback){
				highWaterCallback(shared_from_this(),bytes4Send_);
			}			
		}
		break;
		case callFlushCallback:{
			if(flushCallback){
				flushCallback(shared_from_this());
			}
			if(closedOnFlush_){
				this->Close();
			}			
		}
		break;
		case callErrorCallback:{
			if(errorCallback) {
				errorCallback(shared_from_this(),err);
			} else {
				this->Close();
			}				
		}
		break;
		default:{
			return;
		}
	}
}